

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O3

S1Angle S2::GetPerimeter(S2Shape *shape)

{
  S2PointLoopSpan loop;
  int iVar1;
  int chain_id;
  S1Angle SVar2;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double local_50;
  pointer pVVar3;
  pointer pVVar4;
  
  iVar1 = (*shape->_vptr_S2Shape[4])();
  local_50 = 0.0;
  if (iVar1 == 2) {
    pVVar3 = (pointer)0x0;
    pVVar4 = (pointer)0x0;
    iVar1 = (*shape->_vptr_S2Shape[6])(shape);
    if (iVar1 < 1) {
      local_50 = 0.0;
    }
    else {
      local_50 = 0.0;
      chain_id = 0;
      do {
        GetChainVertices(shape,chain_id,
                         (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                         &stack0xffffffffffffffb8);
        loop.super_S2PointSpan.len_ = (size_type)pVVar4;
        loop.super_S2PointSpan.ptr_ = pVVar3;
        SVar2 = GetPerimeter(loop);
        local_50 = local_50 + SVar2.radians_;
        chain_id = chain_id + 1;
      } while (iVar1 != chain_id);
      if (pVVar3 != (pointer)0x0) {
        operator_delete(pVVar3);
      }
    }
  }
  return (S1Angle)local_50;
}

Assistant:

S1Angle GetPerimeter(const S2Shape& shape) {
  if (shape.dimension() != 2) return S1Angle::Zero();
  S1Angle perimeter;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    perimeter += S2::GetPerimeter(S2PointLoopSpan(vertices));
  }
  return perimeter;
}